

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall clipp::parameter::parameter<>(parameter *this,arg_string *str)

{
  string *in_RSI;
  long in_RDI;
  parameter *this_00;
  match_predicate *in_stack_ffffffffffffff48;
  action_provider<clipp::parameter> *in_stack_ffffffffffffff50;
  string local_80 [128];
  
  detail::token<clipp::parameter>::token((token<clipp::parameter> *)in_stack_ffffffffffffff50);
  detail::action_provider<clipp::parameter>::action_provider(in_stack_ffffffffffffff50);
  this_00 = (parameter *)(in_RDI + 0xa0);
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x188a6a);
  std::function<bool(std::__cxx11::string_const&)>::
  function<bool(&)(std::__cxx11::string_const&),void>
            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00,
             (_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             in_RSI);
  predicate_adapter::predicate_adapter
            ((predicate_adapter *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00,(predicate_adapter *)in_RSI);
  predicate_adapter::~predicate_adapter((predicate_adapter *)0x188ac5);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x188acf);
  std::__cxx11::string::string((string *)(in_RDI + 0xd8));
  *(undefined1 *)(in_RDI + 0xf8) = 0;
  *(undefined1 *)(in_RDI + 0xf9) = 0;
  std::__cxx11::string::string(local_80,in_RSI);
  add_flags(this_00,(arg_string *)in_RSI);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

explicit
    parameter(arg_string str, Strings&&... strs):
        flags_{},
        matcher_{predicate_adapter{match::none}},
        label_{}, required_{false}, greedy_{false}
    {
        add_flags(std::move(str), std::forward<Strings>(strs)...);
    }